

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cordz_info.cc
# Opt level: O1

void __thiscall absl::lts_20240722::cord_internal::CordzInfo::Untrack(CordzInfo *this)

{
  RefcountAndFlags *pRVar1;
  uint uVar2;
  List *pLVar3;
  CordzInfo *pCVar4;
  __pointer_type pCVar5;
  __pointer_type pCVar6;
  char cVar7;
  uint uVar8;
  undefined8 extraout_RAX;
  atomic<absl::lts_20240722::cord_internal::CordzInfo_*> *paVar9;
  
  ODRCheck(this);
  pLVar3 = this->list_;
  uVar8 = (pLVar3->mutex).lockword_.super___atomic_base<unsigned_int>._M_i;
  if ((uVar8 & 1) == 0) {
    LOCK();
    uVar2 = (pLVar3->mutex).lockword_.super___atomic_base<unsigned_int>._M_i;
    if (uVar8 == uVar2) {
      (pLVar3->mutex).lockword_.super___atomic_base<unsigned_int>._M_i = uVar8 | 1;
      uVar2 = uVar8;
    }
    uVar8 = uVar2;
    UNLOCK();
  }
  if ((uVar8 & 1) != 0) {
    absl::lts_20240722::base_internal::SpinLock::SlowLock();
  }
  pCVar4 = (this->list_->head)._M_b._M_p;
  pCVar5 = (this->ci_next_)._M_b._M_p;
  pCVar6 = (this->ci_prev_)._M_b._M_p;
  if (pCVar5 == (__pointer_type)0x0) {
LAB_001027e5:
    if (pCVar6 == (__pointer_type)0x0) {
      if (pCVar4 == this) {
        paVar9 = &this->list_->head;
LAB_00102817:
        (paVar9->_M_b)._M_p = pCVar5;
        LOCK();
        uVar8 = (pLVar3->mutex).lockword_.super___atomic_base<unsigned_int>._M_i;
        (pLVar3->mutex).lockword_.super___atomic_base<unsigned_int>._M_i =
             (pLVar3->mutex).lockword_.super___atomic_base<unsigned_int>._M_i & 2;
        UNLOCK();
        if (7 < uVar8) {
          absl::lts_20240722::base_internal::SpinLock::SlowUnlock((uint)pLVar3);
        }
        cVar7 = absl::lts_20240722::cord_internal::CordzHandle::SafeToDelete();
        if (cVar7 == '\0') {
          absl::lts_20240722::Mutex::Lock();
          if (this->rep_ != (CordRep *)0x0) {
            LOCK();
            pRVar1 = &this->rep_->refcount;
            (pRVar1->count_).super___atomic_base<int>._M_i =
                 (pRVar1->count_).super___atomic_base<int>._M_i + 2;
            UNLOCK();
          }
          absl::lts_20240722::Mutex::Unlock();
          absl::lts_20240722::cord_internal::CordzHandle::Delete(&this->super_CordzHandle);
          return;
        }
        this->rep_ = (CordRep *)0x0;
        (**(code **)(*(long *)this + 8))(this);
        return;
      }
      goto LAB_001028a1;
    }
    if (pCVar4 == this) goto LAB_00102897;
    if ((pCVar6->ci_next_)._M_b._M_p == this) {
      paVar9 = &pCVar6->ci_next_;
      goto LAB_00102817;
    }
  }
  else {
    if ((pCVar5->ci_prev_)._M_b._M_p == this) {
      (pCVar5->ci_prev_)._M_b._M_p = pCVar6;
      goto LAB_001027e5;
    }
    Untrack();
LAB_00102897:
    Untrack();
  }
  Untrack();
LAB_001028a1:
  Untrack();
  __clang_call_terminate(extraout_RAX);
}

Assistant:

void CordzInfo::Untrack() {
  ODRCheck();
  {
    SpinLockHolder l(&list_->mutex);

    CordzInfo* const head = list_->head.load(std::memory_order_acquire);
    CordzInfo* const next = ci_next_.load(std::memory_order_acquire);
    CordzInfo* const prev = ci_prev_.load(std::memory_order_acquire);

    if (next) {
      ABSL_ASSERT(next->ci_prev_.load(std::memory_order_acquire) == this);
      next->ci_prev_.store(prev, std::memory_order_release);
    }
    if (prev) {
      ABSL_ASSERT(head != this);
      ABSL_ASSERT(prev->ci_next_.load(std::memory_order_acquire) == this);
      prev->ci_next_.store(next, std::memory_order_release);
    } else {
      ABSL_ASSERT(head == this);
      list_->head.store(next, std::memory_order_release);
    }
  }

  // We can no longer be discovered: perform a fast path check if we are not
  // listed on any delete queue, so we can directly delete this instance.
  if (SafeToDelete()) {
    UnsafeSetCordRep(nullptr);
    delete this;
    return;
  }

  // We are likely part of a snapshot, extend the life of the CordRep
  {
    absl::MutexLock lock(&mutex_);
    if (rep_) CordRep::Ref(rep_);
  }
  CordzHandle::Delete(this);
}